

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

Vec_Str_t * Gia_ManIsoFindString(Gia_Man_t *p,int iPo,int fVerbose,Vec_Int_t **pvPiPerm)

{
  void **ppvVar1;
  void *__ptr;
  Gia_Man_t *p_00;
  Vec_Ptr_t *__ptr_00;
  Vec_Int_t *vCis;
  int *piVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Str_t *pVVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int local_34;
  
  local_34 = iPo;
  p_00 = Gia_ManDupCones(p,&local_34,1,1);
  if (p_00->vCos->nSize - p_00->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pPart) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x3ef,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
  }
  if (p_00->vCis->nSize == 0) {
    if (p_00->nObjs != 2) {
      __assert_fail("Gia_ManObjNum(pPart) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x3f3,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
    }
    pVVar5 = Gia_AigerWriteIntoMemoryStr(p_00);
    Gia_ManStop(p_00);
    if (pvPiPerm != (Vec_Int_t **)0x0) {
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      pVVar3->nCap = 0;
      pVVar3->nSize = 0;
      pVVar3->pArray = (int *)0x0;
      *pvPiPerm = pVVar3;
    }
  }
  else {
    __ptr_00 = Gia_IsoDeriveEquivPos(p_00,0,fVerbose);
    if (__ptr_00 != (Vec_Ptr_t *)0x0) {
      iVar8 = __ptr_00->nSize;
      if (0 < (long)iVar8) {
        ppvVar1 = __ptr_00->pArray;
        lVar9 = 0;
        do {
          __ptr = ppvVar1[lVar9];
          if (__ptr != (void *)0x0) {
            if (*(void **)((long)__ptr + 8) != (void *)0x0) {
              free(*(void **)((long)__ptr + 8));
              *(undefined8 *)((long)__ptr + 8) = 0;
            }
            free(__ptr);
          }
          lVar9 = lVar9 + 1;
        } while (iVar8 != lVar9);
      }
      if (__ptr_00->pArray != (void **)0x0) {
        free(__ptr_00->pArray);
        __ptr_00->pArray = (void **)0x0;
      }
      free(__ptr_00);
    }
    pVVar3 = p_00->vCis;
    iVar8 = pVVar3->nSize;
    vCis = (Vec_Int_t *)malloc(0x10);
    if (iVar8 - 1U < 0xf) {
      iVar8 = 0x10;
    }
    vCis->nSize = 0;
    vCis->nCap = iVar8;
    if (iVar8 == 0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)malloc((long)iVar8 << 2);
    }
    vCis->pArray = piVar2;
    iVar6 = p_00->nObjs;
    pVVar4 = p_00->vCos;
    uVar7 = ~(pVVar4->nSize + pVVar3->nSize);
    iVar8 = iVar6 + uVar7;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    if (iVar6 + -1 + uVar7 < 0xf) {
      iVar8 = 0x10;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = iVar8;
    if (iVar8 == 0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)malloc((long)iVar8 << 2);
    }
    pVVar3->pArray = piVar2;
    iVar8 = pVVar4->nSize;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    iVar6 = 0x10;
    if (0xe < iVar8 - 1U) {
      iVar6 = iVar8;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar6;
    if (iVar6 == 0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)malloc((long)iVar6 << 2);
    }
    pVVar4->pArray = piVar2;
    Gia_ManFindCaninicalOrder(p_00,vCis,pVVar3,pVVar4,pvPiPerm);
    pVVar5 = Gia_AigerWriteIntoMemoryStrPart(p_00,vCis,pVVar3,pVVar4,p_00->nRegs);
    if (vCis->pArray != (int *)0x0) {
      free(vCis->pArray);
      vCis->pArray = (int *)0x0;
    }
    free(vCis);
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    free(pVVar3);
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (int *)0x0;
    }
    free(pVVar4);
    Gia_ManStop(p_00);
  }
  return pVVar5;
}

Assistant:

Vec_Str_t * Gia_ManIsoFindString( Gia_Man_t * p, int iPo, int fVerbose, Vec_Int_t ** pvPiPerm )
{
    Gia_Man_t * pPart;
    Vec_Ptr_t * vEquiv;
    Vec_Int_t * vCis, * vAnds, * vCos;
    Vec_Str_t * vStr;
    // duplicate
    pPart = Gia_ManDupCones( p, &iPo, 1, 1 );
//Gia_ManPrint( pPart );
    assert( Gia_ManPoNum(pPart) == 1 );
    if ( Gia_ManCiNum(pPart) == 0 ) // const AIG
    {
        assert( Gia_ManPoNum(pPart) == 1 );
        assert( Gia_ManObjNum(pPart) == 2 );
        vStr = Gia_AigerWriteIntoMemoryStr( pPart );
        Gia_ManStop( pPart );
        if ( pvPiPerm )
            *pvPiPerm = Vec_IntAlloc( 0 );
        return vStr;
    }
    // derive canonical values
    vEquiv = Gia_IsoDeriveEquivPos( pPart, 0, fVerbose );
    Vec_VecFreeP( (Vec_Vec_t **)&vEquiv );
    // find canonical order
    vCis  = Vec_IntAlloc( Gia_ManCiNum(pPart) );
    vAnds = Vec_IntAlloc( Gia_ManAndNum(pPart) );
    vCos  = Vec_IntAlloc( Gia_ManCoNum(pPart) );
    Gia_ManFindCaninicalOrder( pPart, vCis, vAnds, vCos, pvPiPerm );
//printf( "Internal: " );
//Vec_IntPrint( vCis );
    // derive the AIGER string
    vStr = Gia_AigerWriteIntoMemoryStrPart( pPart, vCis, vAnds, vCos, Gia_ManRegNum(pPart) );
    // cleanup
    Vec_IntFree( vCis );
    Vec_IntFree( vAnds );
    Vec_IntFree( vCos );
    Gia_ManStop( pPart );
    return vStr;
}